

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

void flush_dpb_buf_slot(H264_DecCtx_t *p_Dec)

{
  MppFrame local_28;
  MppFrame mframe;
  H264_DpbMark_t *p_mark;
  H264_DecCtx_t *pHStack_10;
  RK_U32 i;
  H264_DecCtx_t *p_Dec_local;
  
  pHStack_10 = p_Dec;
  for (p_mark._4_4_ = 0; p_mark._4_4_ < 0x23; p_mark._4_4_ = p_mark._4_4_ + 1) {
    mframe = pHStack_10->dpb_mark + p_mark._4_4_;
    if ((((h264_dpb_mark_t *)mframe != (h264_dpb_mark_t *)0x0) &&
        (((h264_dpb_mark_t *)mframe)->out_flag != '\0')) &&
       (-1 < ((h264_dpb_mark_t *)mframe)->slot_idx)) {
      local_28 = (MppFrame)0x0;
      mpp_buf_slot_get_prop
                (pHStack_10->frame_slots,((h264_dpb_mark_t *)mframe)->slot_idx,SLOT_FRAME_PTR,
                 &local_28);
      if (local_28 != (MppFrame)0x0) {
        if ((h264d_debug & 0x2000) != 0) {
          _mpp_log_l(4,"h264d_init","[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                     (char *)0x0,(ulong)*(uint *)((long)mframe + 0x10),(ulong)*mframe,
                     (uint)*(byte *)((long)mframe + 1));
        }
        mpp_frame_set_discard(local_28,1);
        mpp_buf_slot_set_flag
                  (pHStack_10->frame_slots,*(RK_S32 *)((long)mframe + 0x10),SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(pHStack_10->frame_slots,*(RK_S32 *)((long)mframe + 0x10),QUEUE_DISPLAY)
        ;
        mpp_buf_slot_clr_flag
                  (pHStack_10->frame_slots,*(RK_S32 *)((long)mframe + 0x10),SLOT_CODEC_USE);
        pHStack_10->last_frame_slot_idx = *(RK_S32 *)((long)mframe + 0x10);
      }
    }
    reset_dpb_mark((H264_DpbMark_t *)mframe);
  }
  return;
}

Assistant:

void flush_dpb_buf_slot(H264_DecCtx_t *p_Dec)
{
    RK_U32 i = 0;
    H264_DpbMark_t *p_mark = NULL;

    for (i = 0; i < MAX_MARK_SIZE; i++) {
        p_mark = &p_Dec->dpb_mark[i];
        if (p_mark && p_mark->out_flag && (p_mark->slot_idx >= 0)) {
            MppFrame mframe = NULL;
            mpp_buf_slot_get_prop(p_Dec->frame_slots, p_mark->slot_idx, SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                H264D_DBG(H264D_DBG_SLOT_FLUSH, "[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                          p_mark->slot_idx, p_mark->top_used, p_mark->bot_used);
                mpp_frame_set_discard(mframe, 1);
                mpp_buf_slot_set_flag(p_Dec->frame_slots, p_mark->slot_idx, SLOT_QUEUE_USE);
                mpp_buf_slot_enqueue(p_Dec->frame_slots, p_mark->slot_idx, QUEUE_DISPLAY);
                mpp_buf_slot_clr_flag(p_Dec->frame_slots, p_mark->slot_idx, SLOT_CODEC_USE);
                p_Dec->last_frame_slot_idx = p_mark->slot_idx;
            }
        }
        reset_dpb_mark(p_mark);
    }
}